

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_serialize.c
# Opt level: O1

int32_t pcre2_serialize_decode_16
                  (pcre2_code_16 **codes,int32_t number_of_codes,uint8_t *bytes,
                  pcre2_general_context_16 *gcontext)

{
  byte *pbVar1;
  uint uVar2;
  bool bVar3;
  uint8_t *__dest;
  void *pvVar4;
  pcre2_code_16 *ppVar5;
  uint8_t *puVar6;
  pcre2_compile_context_16 *ppVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  
  ppVar7 = (pcre2_compile_context_16 *)gcontext;
  if (gcontext == (pcre2_general_context_16 *)0x0) {
    ppVar7 = &_pcre2_default_compile_context_16;
  }
  uVar9 = 0xffffffcd;
  if (codes != (pcre2_code_16 **)0x0 && bytes != (uint8_t *)0x0) {
    if (number_of_codes < 1) {
      uVar9 = 0xffffffe3;
    }
    else {
      uVar2 = *(uint *)(bytes + 0xc);
      if ((int)uVar2 < 1) {
        uVar9 = 0xffffffc2;
      }
      else {
        uVar9 = 0xffffffe1;
        if (((*(int *)bytes == 0x50523253) && (uVar9 = 0xffffffe0, *(int *)(bytes + 4) == 0x20000a))
           && (*(int *)(bytes + 8) == 0x80802)) {
          if ((int)uVar2 < number_of_codes) {
            number_of_codes = uVar2;
          }
          __dest = (uint8_t *)(*(ppVar7->memctl).malloc)(0x448,(ppVar7->memctl).memory_data);
          if (__dest == (uint8_t *)0x0) {
            uVar9 = 0xffffffd0;
          }
          else {
            pvVar4 = memcpy(__dest,bytes + 0x10,0x440);
            *(ulong *)(__dest + 0x440) = (ulong)(uint)number_of_codes;
            puVar6 = bytes + 0x450;
            uVar8 = 0;
            do {
              uVar10 = *(ulong *)(puVar6 + 0x48);
              if (uVar10 < 0x89) {
                bVar3 = false;
                pvVar4 = (void *)0xffffffc2;
              }
              else {
                ppVar5 = (pcre2_code_16 *)_pcre2_memctl_malloc_16(uVar10,&gcontext->memctl);
                if (ppVar5 == (pcre2_code_16 *)0x0) {
                  (*(ppVar7->memctl).free)(__dest,(ppVar7->memctl).memory_data);
                  pvVar4 = (void *)0xffffffd0;
                  if (uVar8 != 0) {
                    uVar10 = 0;
                    do {
                      (*(ppVar7->memctl).free)(codes[uVar10],(ppVar7->memctl).memory_data);
                      codes[uVar10] = (pcre2_code_16 *)0x0;
                      uVar10 = uVar10 + 1;
                    } while (uVar8 != uVar10);
                  }
                }
                else {
                  memcpy(&ppVar5->tables,puVar6 + 0x18,uVar10 - 0x18);
                  if (((ppVar5->magic_number == 0x50435245) && (ppVar5->name_entry_size < 0x23)) &&
                     (ppVar5->name_count < 0x2711)) {
                    ppVar5->tables = __dest;
                    ppVar5->executable_jit = (void *)0x0;
                    pbVar1 = (byte *)((long)&ppVar5->flags + 2);
                    *pbVar1 = *pbVar1 | 4;
                    codes[uVar8] = ppVar5;
                    puVar6 = puVar6 + uVar10;
                    bVar3 = true;
                    pvVar4 = (void *)((ulong)pvVar4 & 0xffffffff);
                    goto LAB_0015fbc9;
                  }
                  (*(ppVar7->memctl).free)(ppVar5,(ppVar7->memctl).memory_data);
                  pvVar4 = (void *)0xffffffc2;
                }
                bVar3 = false;
              }
LAB_0015fbc9:
              uVar9 = (uint)pvVar4;
            } while ((bVar3) &&
                    (uVar8 = uVar8 + 1, uVar9 = number_of_codes, uVar8 != (uint)number_of_codes));
          }
        }
      }
    }
  }
  return uVar9;
}

Assistant:

PCRE2_CALL_CONVENTION
pcre2_serialize_decode(pcre2_code **codes, int32_t number_of_codes,
   const uint8_t *bytes, pcre2_general_context *gcontext)
{
const pcre2_serialized_data *data = (const pcre2_serialized_data *)bytes;
const pcre2_memctl *memctl = (gcontext != NULL) ?
  &gcontext->memctl : &PRIV(default_compile_context).memctl;

const uint8_t *src_bytes;
pcre2_real_code *dst_re;
uint8_t *tables;
int32_t i, j;

/* Sanity checks. */

if (data == NULL || codes == NULL) return PCRE2_ERROR_NULL;
if (number_of_codes <= 0) return PCRE2_ERROR_BADDATA;
if (data->number_of_codes <= 0) return PCRE2_ERROR_BADSERIALIZEDDATA;
if (data->magic != SERIALIZED_DATA_MAGIC) return PCRE2_ERROR_BADMAGIC;
if (data->version != SERIALIZED_DATA_VERSION) return PCRE2_ERROR_BADMODE;
if (data->config != SERIALIZED_DATA_CONFIG) return PCRE2_ERROR_BADMODE;

if (number_of_codes > data->number_of_codes)
  number_of_codes = data->number_of_codes;

src_bytes = bytes + sizeof(pcre2_serialized_data);

/* Decode tables. The reference count for the tables is stored immediately
following them. */

tables = memctl->malloc(tables_length + sizeof(PCRE2_SIZE), memctl->memory_data);
if (tables == NULL) return PCRE2_ERROR_NOMEMORY;

memcpy(tables, src_bytes, tables_length);
*(PCRE2_SIZE *)(tables + tables_length) = number_of_codes;
src_bytes += tables_length;

/* Decode the byte stream. We must not try to read the size from the compiled
code block in the stream, because it might be unaligned, which causes errors on
hardware such as Sparc-64 that doesn't like unaligned memory accesses. The type
of the blocksize field is given its own name to ensure that it is the same here
as in the block. */

for (i = 0; i < number_of_codes; i++)
  {
  CODE_BLOCKSIZE_TYPE blocksize;
  memcpy(&blocksize, src_bytes + offsetof(pcre2_real_code, blocksize),
    sizeof(CODE_BLOCKSIZE_TYPE));
  if (blocksize <= sizeof(pcre2_real_code))
    return PCRE2_ERROR_BADSERIALIZEDDATA;

  /* The allocator provided by gcontext replaces the original one. */

  dst_re = (pcre2_real_code *)PRIV(memctl_malloc)(blocksize,
    (pcre2_memctl *)gcontext);
  if (dst_re == NULL)
    {
    memctl->free(tables, memctl->memory_data);
    for (j = 0; j < i; j++)
      {
      memctl->free(codes[j], memctl->memory_data);
      codes[j] = NULL;
      }
    return PCRE2_ERROR_NOMEMORY;
    }

  /* The new allocator must be preserved. */

  memcpy(((uint8_t *)dst_re) + sizeof(pcre2_memctl),
    src_bytes + sizeof(pcre2_memctl), blocksize - sizeof(pcre2_memctl));
  if (dst_re->magic_number != MAGIC_NUMBER ||
      dst_re->name_entry_size > MAX_NAME_SIZE + IMM2_SIZE + 1 ||
      dst_re->name_count > MAX_NAME_COUNT)
    {   
    memctl->free(dst_re, memctl->memory_data); 
    return PCRE2_ERROR_BADSERIALIZEDDATA;
    } 

  /* At the moment only one table is supported. */

  dst_re->tables = tables;
  dst_re->executable_jit = NULL;
  dst_re->flags |= PCRE2_DEREF_TABLES;

  codes[i] = dst_re;
  src_bytes += blocksize;
  }

return number_of_codes;
}